

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::WritePhonyBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,cmNinjaDeps *outputs,
          cmNinjaDeps *explicitDeps,cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,
          cmNinjaVars *variables)

{
  cmNinjaDeps *implicitDeps_00;
  cmNinjaDeps *explicitDeps_00;
  cmNinjaDeps *outputs_00;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  allocator local_69;
  string local_68;
  cmNinjaDeps *local_48;
  cmNinjaDeps *implicitDeps_local;
  cmNinjaDeps *explicitDeps_local;
  cmNinjaDeps *outputs_local;
  string *comment_local;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_48 = implicitDeps;
  implicitDeps_local = explicitDeps;
  explicitDeps_local = outputs;
  outputs_local = (cmNinjaDeps *)comment;
  comment_local = (string *)os;
  os_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"phony",&local_69);
  outputs_00 = explicitDeps_local;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98);
  explicitDeps_00 = implicitDeps_local;
  implicitDeps_00 = local_48;
  std::__cxx11::string::string((string *)&local_b8);
  WriteBuild(this,os,comment,&local_68,outputs_00,&local_98,explicitDeps_00,implicitDeps_00,
             orderOnlyDeps,variables,&local_b8,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WritePhonyBuild(
  std::ostream& os, const std::string& comment, const cmNinjaDeps& outputs,
  const cmNinjaDeps& explicitDeps, const cmNinjaDeps& implicitDeps,
  const cmNinjaDeps& orderOnlyDeps, const cmNinjaVars& variables)
{
  this->WriteBuild(os, comment, "phony", outputs,
                   /*implicitOuts=*/cmNinjaDeps(), explicitDeps, implicitDeps,
                   orderOnlyDeps, variables);
}